

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatefootprint.cpp
# Opt level: O3

void __thiscall ValidateFootprint::ReadFootprintFile(ValidateFootprint *this)

{
  Validate *this_00;
  int *__args;
  OASIS_FLOAT *pOVar1;
  AREAPERIL_INT AVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  size_t sVar8;
  int iVar9;
  iterator iVar10;
  float local_6c;
  undefined8 local_68;
  undefined2 local_60;
  OASIS_FLOAT local_5c;
  int *local_58;
  vector<int,std::allocator<int>> *local_50;
  char *local_48;
  char *local_40;
  longlong *local_38;
  
  local_5c = 0.0;
  ReadFirstFootprintLine(this,&local_5c);
  if (this->convertToBin_ == true) {
    (*this->_vptr_ValidateFootprint[1])(this);
  }
  this_00 = &this->super_Validate;
  local_6c = local_5c;
  pcVar6 = fgets(this_00->line_,0x1000,_stdin);
  if (pcVar6 != (char *)0x0) {
    local_38 = &this->initialEveID_;
    __args = &(this->fr_).super_EventRow.intensity_bin_id;
    pOVar1 = &(this->fr_).super_EventRow.probability;
    local_58 = &(this->super_Validate).lineno_;
    local_40 = this->eveIDName_;
    local_48 = this->areaperilIDName_;
    local_50 = (vector<int,std::allocator<int>> *)&this->intensityBinIDs_;
    do {
      iVar4 = __isoc99_sscanf(this_00,"%lld,%llu,%d,%f",local_38,&this->initialAreaperilID_,__args,
                              pOVar1);
      if (iVar4 == 4) {
        iVar4 = Validate::CheckIDDoesNotExceedMaxLimit(this_00,local_40,this->initialEveID_);
        (this->fr_).event_id = iVar4;
        uVar5 = Validate::CheckIDDoesNotExceedMaxLimit(this_00,local_48,this->initialAreaperilID_);
        (this->fr_).super_EventRow.areaperil_id = uVar5;
        iVar4 = (this->fr_).event_id;
        iVar9 = this->prevEventID_;
        if (uVar5 == this->prevAreaPerilID_ && iVar4 == iVar9) {
          _Var7 = std::
                  __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                            ((this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish,__args);
          iVar10._M_current =
               (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (_Var7._M_current == iVar10._M_current) {
            if (_Var7._M_current ==
                (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_50,iVar10,__args);
            }
            else {
              *iVar10._M_current = (this->fr_).super_EventRow.intensity_bin_id;
              (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar10._M_current + 1;
            }
          }
          else {
            fprintf(_stderr,
                    "ERROR: Duplicate intensity bin %d on line %d for event ID %d areaperil ID %u:\n%s\n"
                    ,(ulong)(uint)(this->fr_).super_EventRow.intensity_bin_id,
                    (ulong)(uint)(this->super_Validate).lineno_,(ulong)(uint)(this->fr_).event_id,
                    (ulong)(this->fr_).super_EventRow.areaperil_id,this_00);
            Validate::PrintErrorMessage(this_00);
          }
          local_6c = local_6c + *pOVar1;
        }
        else {
          if ((int)(local_6c * 10000.0 + 0.5) != 10000) {
            fprintf(_stderr,
                    "ERROR: Probabilities for event ID %d and areaperil ID %u do not sum to 1.0 (total probability = %f).\n"
                    ,(double)local_6c);
            Validate::PrintErrorMessage(this_00);
            iVar4 = (this->fr_).event_id;
            iVar9 = this->prevEventID_;
          }
          if (iVar4 < iVar9) {
            local_68 = CONCAT26(local_68._6_2_,0x7400000000);
            local_68 = CONCAT44(local_68._4_4_,0x6e657645);
LAB_00102bfa:
            fprintf(_stderr,"%s IDs in lines %d and %d are not in ascending order:\n%s\n%s\n",
                    &local_68,(ulong)(*local_58 - 1),(ulong)(uint)*local_58,this->prevLine_,this_00)
            ;
            Validate::PrintErrorMessage(this_00);
          }
          else if ((iVar4 == iVar9) &&
                  ((this->fr_).super_EventRow.areaperil_id < this->prevAreaPerilID_)) {
            local_68 = 0x6972657061657241;
            local_60 = 0x6c;
            goto LAB_00102bfa;
          }
          piVar3 = (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar10._M_current =
               (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar10._M_current != piVar3) {
            (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar3;
            iVar10._M_current = piVar3;
          }
          if (iVar10._M_current ==
              (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_50,iVar10,__args);
          }
          else {
            *iVar10._M_current = (this->fr_).super_EventRow.intensity_bin_id;
            (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar10._M_current + 1;
          }
          local_6c = *pOVar1;
        }
        if (this->convertToBin_ == true) {
          if ((this->fr_).event_id != this->prevEventID_) {
            (*this->_vptr_ValidateFootprint[2])(this);
          }
          (*this->_vptr_ValidateFootprint[1])(this);
        }
        else {
          iVar4 = (this->fr_).super_EventRow.intensity_bin_id;
          if (this->maxIntensityBin_ < iVar4) {
            this->maxIntensityBin_ = iVar4;
          }
        }
        piVar3 = &(this->super_Validate).lineno_;
        *piVar3 = *piVar3 + 1;
        AVar2 = (this->fr_).super_EventRow.areaperil_id;
        this->prevEventID_ = (this->fr_).event_id;
        this->prevAreaPerilID_ = AVar2;
        sVar8 = strlen(this_00->line_);
        memcpy(this->prevLine_,this_00,sVar8 + 1);
        sVar8 = strlen(this_00->line_);
        this->prevLine_[sVar8 - 1] = '\0';
      }
      else {
        ReadFootprintFile();
      }
      pcVar6 = fgets(this_00->line_,0x1000,_stdin);
    } while (pcVar6 != (char *)0x0);
  }
  if ((int)(local_6c * 10000.0 + 0.5) != 10000) {
    ReadFootprintFile();
  }
  iVar4 = (this->fr_).event_id;
  if (iVar4 < this->prevEventID_) {
    local_68 = CONCAT26(local_68._6_2_,0x7400000000);
    local_68 = CONCAT44(local_68._4_4_,0x6e657645);
  }
  else {
    if ((iVar4 != this->prevEventID_) ||
       (this->prevAreaPerilID_ <= (this->fr_).super_EventRow.areaperil_id)) goto LAB_00102ddf;
    local_68 = 0x6972657061657241;
    local_60 = 0x6c;
  }
  uVar5 = (this->super_Validate).lineno_;
  fprintf(_stderr,"%s IDs in lines %d and %d are not in ascending order:\n%s\n%s\n",&local_68,
          (ulong)(uVar5 - 1),(ulong)uVar5,this->prevLine_,this_00);
  Validate::PrintErrorMessage(this_00);
LAB_00102ddf:
  if (this->convertToBin_ == true) {
    (*this->_vptr_ValidateFootprint[2])(this);
  }
  return;
}

Assistant:

void ValidateFootprint::ReadFootprintFile() {
/* After reading in a line from the csv file and checking for data integrity,
 * this method calls other methods to check:
 * 
 * - Total probability for each event ID-areaperil ID pair sums to 1.0.
 * - Event and areaperil IDs are in ascending order.
 * - Unique intensity bin IDs for each event ID-areaperil ID pair. */

  OASIS_FLOAT totalProbability = 0.0;
  ReadFirstFootprintLine(totalProbability);
  if (convertToBin_) WriteBinFootprintFile();   // Write first footprint line

  while (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      fr_.event_id = CheckIDDoesNotExceedMaxLimit(eveIDName_, initialEveID_);
#ifdef AREAPERIL_TYPE_UNSIGNED_LONG_LONG
      // If areaperil ID is of data type unsigned long long, it is not possible
      // to check for overflow
      fr_.areaperil_id = initialAreaperilID_;
#else
      fr_.areaperil_id = CheckIDDoesNotExceedMaxLimit(areaperilIDName_,
						      initialAreaperilID_);
#endif

      // New event and/or areaperil IDs.
      // Check probabilities sum to 1.0 for each event ID-areaperil ID
      // combination and event IDs and areaperil IDs are in ascending order.
      if ((fr_.event_id != prevEventID_) || 
	  (fr_.areaperil_id != prevAreaPerilID_)) {

        CheckProbability(totalProbability);
	CheckOrder();

	// Reset for next event
	intensityBinIDs_.clear();
	intensityBinIDs_.push_back(fr_.intensity_bin_id);
	totalProbability = fr_.probability;

      } else {

        CheckIntensityBins();
	totalProbability += fr_.probability;

      }

      if (convertToBin_) {

	if (fr_.event_id != prevEventID_) WriteIdxFootprintFile();
        WriteBinFootprintFile();

      } else {

        // Maximum intensity bin index value is required for binary conversion
	// in the future.
        SetMaximumIntensityBinIndex();

      }

      StoreLine();
      continue;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  // Check probabilities sum to 1.0 for last event ID-areaperil ID combination
  // and event IDs and areaperil IDs are in ascending order for last row
  CheckProbability(totalProbability);
  CheckOrder();
  // Write index row for last event ID-areaperil ID combination
  if (convertToBin_) WriteIdxFootprintFile();

}